

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffs2tm(char *datestr,int *year,int *month,int *day,int *hour,int *minute,double *second,
          int *status)

{
  char cVar1;
  ushort *puVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ushort **ppuVar6;
  char *pcVar7;
  char *__nptr;
  double dVar8;
  char errmsg [81];
  
  pcVar7 = errmsg;
  if (0 < *status) {
    return *status;
  }
  if (year != (int *)0x0) {
    *year = 0;
  }
  if (month != (int *)0x0) {
    *month = 0;
  }
  if (day != (int *)0x0) {
    *day = 0;
  }
  if (hour != (int *)0x0) {
    *hour = 0;
  }
  if (minute != (int *)0x0) {
    *minute = 0;
  }
  if (second != (double *)0x0) {
    *second = 0.0;
  }
  if (datestr == (char *)0x0) {
    pcVar7 = "error: null input date string (ffs2tm)";
LAB_001a9532:
    ffpmsg(pcVar7);
    *status = 0x1a4;
    iVar3 = 0x1a4;
  }
  else {
    if ((datestr[2] != '/') && (cVar1 = datestr[4], (long)cVar1 != 0x2d)) {
      if ((datestr[2] == ':') && (datestr[5] == ':')) {
        ppuVar6 = __ctype_b_loc();
        puVar2 = *ppuVar6;
        if ((((((*(byte *)((long)puVar2 + (long)*datestr * 2 + 1) & 8) != 0) &&
              ((*(byte *)((long)puVar2 + (long)datestr[1] * 2 + 1) & 8) != 0)) &&
             ((*(byte *)((long)puVar2 + (long)datestr[3] * 2 + 1) & 8) != 0)) &&
            (((*(byte *)((long)puVar2 + (long)cVar1 * 2 + 1) & 8) != 0 &&
             ((*(byte *)((long)puVar2 + (long)datestr[6] * 2 + 1) & 8) != 0)))) &&
           ((*(byte *)((long)puVar2 + (long)datestr[7] * 2 + 1) & 8) != 0)) {
          if (hour != (int *)0x0) {
            iVar3 = atoi(datestr);
            *hour = iVar3;
          }
          if (minute != (int *)0x0) {
            iVar3 = atoi(datestr + 3);
            *minute = iVar3;
          }
          if (second != (double *)0x0) {
            __nptr = datestr + 6;
LAB_001a950b:
            dVar8 = atof(__nptr);
            *second = dVar8;
          }
          goto LAB_001a9604;
        }
      }
      goto LAB_001a9523;
    }
    iVar3 = ffs2dt(datestr,year,month,day,status);
    if (iVar3 < 1) {
      sVar5 = strlen(datestr);
      uVar4 = (uint)sVar5;
      if ((uVar4 & 0xfffffffd) != 8) {
        if (0x12 < (int)uVar4) {
          if (datestr[10] != 'T') {
LAB_001a9604:
            if ((hour == (int *)0x0) || ((uint)*hour < 0x18)) {
              if ((minute == (int *)0x0) || ((uint)*minute < 0x3c)) {
                if ((second != (double *)0x0) && ((*second < 0.0 || (61.0 <= *second)))) {
                  snprintf(errmsg,0x51,"second value is out of range 0 - 60.9999: %f (ffs2tm)");
                  goto LAB_001a9532;
                }
                goto LAB_001a946b;
              }
              pcVar7 = "minute value is out of range 0 - 59: %d (ffs2tm)";
            }
            else {
              pcVar7 = "hour value is out of range 0 - 23: %d (ffs2tm)";
            }
            snprintf(errmsg,0x51,pcVar7);
            pcVar7 = errmsg;
            goto LAB_001a9532;
          }
          if ((datestr[0xd] == ':') && (datestr[0x10] == ':')) {
            ppuVar6 = __ctype_b_loc();
            puVar2 = *ppuVar6;
            if ((((*(byte *)((long)puVar2 + (long)datestr[0xb] * 2 + 1) & 8) != 0) &&
                ((((*(byte *)((long)puVar2 + (long)datestr[0xc] * 2 + 1) & 8) != 0 &&
                  ((*(byte *)((long)puVar2 + (long)datestr[0xe] * 2 + 1) & 8) != 0)) &&
                 ((*(byte *)((long)puVar2 + (long)datestr[0xf] * 2 + 1) & 8) != 0)))) &&
               ((((*(byte *)((long)puVar2 + (long)datestr[0x11] * 2 + 1) & 8) != 0 &&
                 ((*(byte *)((long)puVar2 + (long)datestr[0x12] * 2 + 1) & 8) != 0)) &&
                ((uVar4 == 0x13 || (datestr[0x13] == '.')))))) {
              if (hour != (int *)0x0) {
                iVar3 = atoi(datestr + 0xb);
                *hour = iVar3;
              }
              if (minute != (int *)0x0) {
                iVar3 = atoi(datestr + 0xe);
                *minute = iVar3;
              }
              if (second != (double *)0x0) {
                __nptr = datestr + 0x11;
                goto LAB_001a950b;
              }
              goto LAB_001a9604;
            }
          }
        }
LAB_001a9523:
        ffpmsg("input date string has illegal format:");
        pcVar7 = datestr;
        goto LAB_001a9532;
      }
    }
LAB_001a946b:
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int ffs2tm(char *datestr,     /* I - date string: "YYYY-MM-DD"    */
                              /*     or "YYYY-MM-DDThh:mm:ss.ddd" */
                              /*     or "dd/mm/yy"                */
           int *year,         /* O - year (0 - 9999)              */
           int *month,        /* O - month (1 - 12)               */
           int *day,          /* O - day (1 - 31)                 */
           int *hour,          /* I - hour (0 - 23)                */
           int *minute,        /* I - minute (0 - 59)              */
           double *second,     /* I - second (0. - 60.9999999)     */
           int   *status)     /* IO - error status                */
/*
  Parse a date character string into date and time values
*/
{
    int slen;
    char errmsg[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (year)
       *year   = 0;
    if (month)
       *month  = 0;
    if (day)
       *day    = 0;
    if (hour)
       *hour   = 0;
    if (minute)
       *minute = 0;
    if (second)
       *second = 0.;

    if (!datestr)
    {
        ffpmsg("error: null input date string (ffs2tm)");
        return(*status = BAD_DATE);   /* Null datestr pointer ??? */
    }

    if (datestr[2] == '/' || datestr[4] == '-')
    {
        /*  Parse the year, month, and date */
        if (ffs2dt(datestr, year, month, day, status) > 0)
            return(*status);

        slen = strlen(datestr);
        if (slen == 8 || slen == 10)
            return(*status);               /* OK, no time fields */
        else if (slen < 19) 
        {
            ffpmsg("input date string has illegal format:");
            ffpmsg(datestr);
            return(*status = BAD_DATE);
        }

        else if (datestr[10] == 'T')
        {
          if (datestr[13] == ':' && datestr[16] == ':') {
            if (isdigit((int) datestr[11]) && isdigit((int) datestr[12])
             && isdigit((int) datestr[14]) && isdigit((int) datestr[15])
             && isdigit((int) datestr[17]) && isdigit((int) datestr[18]) )
             {
                if (slen > 19 && datestr[19] != '.')
                {
                  ffpmsg("input date string has illegal format:");
                  ffpmsg(datestr);
                  return(*status = BAD_DATE);
                }

                /* this is a new format string: "yyyy-mm-ddThh:mm:ss.dddd" */
                if (hour)
                    *hour   = atoi(&datestr[11]);

                if (minute)
                    *minute = atoi(&datestr[14]);

                if (second)
                    *second = atof(&datestr[17]);
             }
             else
             {
                  ffpmsg("input date string has illegal format:");
                  ffpmsg(datestr);
                  return(*status = BAD_DATE);
             }

          }
          else
          {
               ffpmsg("input date string has illegal format:");
               ffpmsg(datestr);
               return(*status = BAD_DATE);
          }
        }
    }
    else   /* no date fields */
    {
        if (datestr[2] == ':' && datestr[5] == ':')   /* time string */
        {
            if (isdigit((int) datestr[0]) && isdigit((int) datestr[1])
             && isdigit((int) datestr[3]) && isdigit((int) datestr[4])
             && isdigit((int) datestr[6]) && isdigit((int) datestr[7]) )
            {
                 /* this is a time string: "hh:mm:ss.dddd" */
                 if (hour)
                    *hour   = atoi(&datestr[0]);

                 if (minute)
                    *minute = atoi(&datestr[3]);

                if (second)
                    *second = atof(&datestr[6]);
            }
            else
            {
                  ffpmsg("input date string has illegal format:");
                  ffpmsg(datestr);
                  return(*status = BAD_DATE);
            }

        }
        else
        {
                  ffpmsg("input date string has illegal format:");
                  ffpmsg(datestr);
                  return(*status = BAD_DATE);
        }

    }

    if (hour)
       if (*hour < 0 || *hour > 23)
       {
          snprintf(errmsg,FLEN_ERRMSG, 
          "hour value is out of range 0 - 23: %d (ffs2tm)", *hour);
          ffpmsg(errmsg);
          return(*status = BAD_DATE);
       }

    if (minute)
       if (*minute < 0 || *minute > 59)
       {
          snprintf(errmsg, FLEN_ERRMSG,
          "minute value is out of range 0 - 59: %d (ffs2tm)", *minute);
          ffpmsg(errmsg);
          return(*status = BAD_DATE);
       }

    if (second)
       if (*second < 0 || *second >= 61.)
       {
          snprintf(errmsg, FLEN_ERRMSG,
          "second value is out of range 0 - 60.9999: %f (ffs2tm)", *second);
          ffpmsg(errmsg);
          return(*status = BAD_DATE);
       }

    return(*status);
}